

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdAddPsbtTxOutWithScript
              (void *handle,void *psbt_handle,int64_t amount,char *locking_script,
              char *redeem_script,char *descriptor,uint32_t *index)

{
  pointer pcVar1;
  NetType_conflict type;
  Psbt *this;
  Psbt *pPVar2;
  bool bVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_args;
  AddressFactory factory;
  Script script;
  Script redeem_script_obj;
  Script temp_script_1;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list_1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Script temp_script;
  Address addr;
  Script temp_wsh_script;
  undefined1 local_ad8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  AddressFactory local_ab8;
  Script local_a90;
  Script local_a58;
  Script local_a20;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_9e8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_9d0;
  undefined1 local_9b8 [32];
  undefined1 local_998 [16];
  pointer local_988;
  _func_int **local_970;
  pointer local_958;
  TapBranch local_940;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_8c8;
  Script local_8b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_870 [11];
  undefined1 local_660 [32];
  char local_640 [16];
  pointer local_630;
  pointer local_618;
  pointer local_600;
  TapBranch local_5e8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_570;
  Script local_558;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_518;
  undefined1 local_4e8 [32];
  undefined1 local_4c8 [16];
  pointer local_4b8;
  _func_int **local_4a0;
  pointer local_488;
  TapBranch local_470;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_3f8;
  Script local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a0 [10];
  undefined1 local_198 [360];
  
  cfd::Initialize();
  pcVar1 = local_4e8 + 0x10;
  local_4e8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_4e8);
  if ((pointer)local_4e8._0_8_ != pcVar1) {
    operator_delete((void *)local_4e8._0_8_);
  }
  if (*(long *)((long)psbt_handle + 0x18) == 0) {
    local_4e8._0_8_ = "cfdcapi_psbt.cpp";
    local_4e8._8_4_ = 0x536;
    local_4e8._16_8_ = "CfdAddPsbtTxOutWithScript";
    cfd::core::logger::log<>((CfdSourceLocation *)local_4e8,kCfdLogLevelWarning,"psbt is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_4e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4e8,"Failed to handle statement. psbt is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_4e8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Script::Script(&local_a90);
  cfd::core::Script::Script(&local_a58);
  bVar3 = cfd::capi::IsEmptyString(locking_script);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_9b8,locking_script,(allocator *)local_660);
    cfd::core::Script::Script((Script *)local_4e8,(string *)local_9b8);
    cfd::core::Script::operator=(&local_a90,(Script *)local_4e8);
    cfd::core::Script::~Script((Script *)local_4e8);
    if ((undefined1 *)local_9b8._0_8_ != local_9b8 + 0x10) {
      operator_delete((void *)local_9b8._0_8_);
    }
  }
  bVar3 = cfd::capi::IsEmptyString(redeem_script);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_9b8,redeem_script,(allocator *)local_660);
    cfd::core::Script::Script((Script *)local_4e8,(string *)local_9b8);
    cfd::core::Script::operator=(&local_a58,(Script *)local_4e8);
    cfd::core::Script::~Script((Script *)local_4e8);
    if ((undefined1 *)local_9b8._0_8_ != local_9b8 + 0x10) {
      operator_delete((void *)local_9b8._0_8_);
    }
  }
  bVar3 = cfd::capi::IsEmptyString(descriptor);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_4e8,descriptor,(allocator *)local_9b8);
    cfd::core::Descriptor::Parse
              ((Descriptor *)local_198,(string *)local_4e8,
               (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)0x0);
    if ((pointer)local_4e8._0_8_ != pcVar1) {
      operator_delete((void *)local_4e8._0_8_);
    }
    local_ad8._0_8_ = (pointer)0x0;
    local_ad8._8_8_ = (pointer)0x0;
    local_ac8._M_allocated_capacity = 0;
    cfd::core::Descriptor::GetKeyDataAll
              (&local_9d0,(Descriptor *)local_198,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Descriptor::GetReferenceAll
              (&local_9e8,(Descriptor *)local_198,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    cfd::core::Script::Script(&local_a20);
    cfd::core::Address::Address((Address *)local_660);
    cfd::core::DescriptorScriptReference::DescriptorScriptReference
              ((DescriptorScriptReference *)local_4e8,
               local_9e8.
               super__Vector_base<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cfd::core::DescriptorScriptReference::GenerateAddress
              ((Address *)local_9b8,(DescriptorScriptReference *)local_4e8,
               *(NetType *)((long)psbt_handle + 0x10));
    cfd::core::Address::operator=((Address *)local_660,(Address *)local_9b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_870);
    cfd::core::Script::~Script(&local_8b0);
    local_940._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_8c8);
    cfd::core::TapBranch::~TapBranch(&local_940);
    if (local_958 != (pointer)0x0) {
      operator_delete(local_958);
    }
    if (local_970 != (_func_int **)0x0) {
      operator_delete(local_970);
    }
    if (local_988 != (pointer)0x0) {
      operator_delete(local_988);
    }
    if ((undefined1 *)local_9b8._16_8_ != local_998) {
      operator_delete((void *)local_9b8._16_8_);
    }
    while (bVar3 = cfd::core::DescriptorScriptReference::HasChild
                             ((DescriptorScriptReference *)local_4e8), bVar3) {
      bVar3 = cfd::core::DescriptorScriptReference::HasRedeemScript
                        ((DescriptorScriptReference *)local_4e8);
      if (bVar3) {
        cfd::core::DescriptorScriptReference::GetRedeemScript
                  ((Script *)local_9b8,(DescriptorScriptReference *)local_4e8);
        cfd::core::Script::operator=(&local_a20,(Script *)local_9b8);
        cfd::core::Script::~Script((Script *)local_9b8);
      }
      cfd::core::DescriptorScriptReference::GetChild
                ((DescriptorScriptReference *)local_9b8,(DescriptorScriptReference *)local_4e8);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)local_4e8,(DescriptorScriptReference *)local_9b8);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)local_9b8);
    }
    bVar3 = cfd::core::DescriptorScriptReference::HasRedeemScript
                      ((DescriptorScriptReference *)local_4e8);
    if (bVar3) {
      cfd::core::DescriptorScriptReference::GetRedeemScript
                ((Script *)local_9b8,(DescriptorScriptReference *)local_4e8);
      cfd::core::Script::operator=(&local_a20,(Script *)local_9b8);
      cfd::core::Script::~Script((Script *)local_9b8);
    }
    bVar3 = cfd::core::Script::IsEmpty(&local_a90);
    if (!bVar3) {
      cfd::core::DescriptorScriptReference::GetLockingScript
                ((Script *)local_9b8,(DescriptorScriptReference *)local_4e8);
      bVar3 = cfd::core::Script::Equals(&local_a90,(Script *)local_9b8);
      cfd::core::Script::~Script((Script *)local_9b8);
      if (!bVar3) {
        local_9b8._0_8_ = local_9b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9b8,"locking_script doesn\'t match the descriptor.","");
        local_ab8._vptr_AddressFactory = (_func_int **)0x5e393a;
        local_ab8.type_ = 0x555;
        local_ab8.prefix_list_.
        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5e3cf4;
        cfd::core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)&local_ab8,kCfdLogLevelWarning,"{}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_ab8,"Failed to parameter. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9b8);
        cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_ab8);
        __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
    }
    bVar3 = cfd::core::Script::IsEmpty(&local_a58);
    if ((!bVar3) && (bVar3 = cfd::core::Script::Equals(&local_a58,&local_a20), !bVar3)) {
      local_9b8._0_8_ = local_9b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9b8,"redeem_script doesn\'t match the descriptor.","");
      local_ab8._vptr_AddressFactory = (_func_int **)0x5e393a;
      local_ab8.type_ = 0x55d;
      local_ab8.prefix_list_.
      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x5e3cf4;
      cfd::core::logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)&local_ab8,kCfdLogLevelWarning,"{}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ab8
                     ,"Failed to parameter. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8)
      ;
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_ab8);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    pPVar2 = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)local_9b8,amount);
    uVar4 = cfd::Psbt::AddTxOutData
                      (pPVar2,(Amount *)local_9b8,(Address *)local_660,&local_a20,&local_9d0);
    cfd::core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)local_4e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_518);
    cfd::core::Script::~Script(&local_558);
    local_5e8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_570);
    cfd::core::TapBranch::~TapBranch(&local_5e8);
    if (local_600 != (pointer)0x0) {
      operator_delete(local_600);
    }
    if (local_618 != (pointer)0x0) {
      operator_delete(local_618);
    }
    if (local_630 != (pointer)0x0) {
      operator_delete(local_630);
    }
    if ((char *)local_660._16_8_ != local_640) {
      operator_delete((void *)local_660._16_8_);
    }
    cfd::core::Script::~Script(&local_a20);
    std::
    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
    ::~vector(&local_9e8);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_9d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_ad8);
    cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_198);
    goto LAB_00417963;
  }
  bVar3 = cfd::core::Script::IsEmpty(&local_a58);
  if ((bVar3) || (bVar3 = cfd::core::Script::IsEmpty(&local_a90), bVar3)) {
    bVar3 = cfd::core::Script::IsEmpty(&local_a90);
    if (bVar3) {
      local_4e8._0_8_ = "cfdcapi_psbt.cpp";
      local_4e8._8_4_ = 0x594;
      local_4e8._16_8_ = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)local_4e8,kCfdLogLevelWarning,
                 "locking_script is null or empty.");
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_4e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4e8,"Failed to parameter. locking_script is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_4e8);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    this = *(Psbt **)((long)psbt_handle + 0x18);
    cfd::core::Amount::Amount((Amount *)local_4e8,amount);
    uVar4 = cfd::core::Psbt::AddTxOut(this,&local_a90,(Amount *)local_4e8);
    goto LAB_00417963;
  }
  cfd::AddressFactory::AddressFactory(&local_ab8,*(NetType *)((long)psbt_handle + 0x10));
  cfd::core::Address::Address((Address *)local_4e8);
  bVar3 = cfd::core::Script::IsP2wshScript(&local_a90);
  if (bVar3) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_660,&local_a58);
    bVar3 = cfd::core::Script::Equals((Script *)local_660,&local_a90);
    if (!bVar3) {
      local_9b8._0_8_ = local_9b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9b8,"locking_script is not match redeem_script.","");
      local_198._0_8_ = "cfdcapi_psbt.cpp";
      local_198._8_4_ = 0x56d;
      local_198._16_8_ = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"{}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     "Failed to parameter. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8)
      ;
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_198);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::AddressFactory::CreateP2wshAddress((Address *)local_9b8,&local_ab8,&local_a58);
    cfd::core::Address::operator=((Address *)local_4e8,(Address *)local_9b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_870);
    cfd::core::Script::~Script(&local_8b0);
    local_940._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_8c8);
    cfd::core::TapBranch::~TapBranch(&local_940);
    if (local_958 != (pointer)0x0) {
      operator_delete(local_958);
    }
    if (local_970 != (_func_int **)0x0) {
      operator_delete(local_970);
    }
    if (local_988 != (pointer)0x0) {
      operator_delete(local_988);
    }
    if ((undefined1 *)local_9b8._16_8_ != local_998) {
      operator_delete((void *)local_9b8._16_8_);
    }
  }
  else {
    bVar3 = cfd::core::Script::IsP2shScript(&local_a90);
    if (!bVar3) {
      local_9b8._0_8_ = local_9b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9b8,"locking_script is not support format.","");
      local_660._0_8_ = "cfdcapi_psbt.cpp";
      local_660._8_4_ = 0x589;
      local_660._16_8_ = "CfdAddPsbtTxOutWithScript";
      cfd::core::logger::log<std::__cxx11::string&>
                ((CfdSourceLocation *)local_660,kCfdLogLevelWarning,"{}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660,
                     "Failed to parameter. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8)
      ;
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_660);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ScriptUtil::CreateP2shLockingScript((Script *)local_660,&local_a58);
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_198,&local_a58);
    cfd::core::ScriptUtil::CreateP2shLockingScript(&local_a20,(Script *)local_198);
    bVar3 = cfd::core::Script::Equals((Script *)local_660,&local_a90);
    if (bVar3) {
      cfd::AddressFactory::CreateP2shAddress((Address *)local_9b8,&local_ab8,&local_a58);
      cfd::core::Address::operator=((Address *)local_4e8,(Address *)local_9b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_870);
      cfd::core::Script::~Script(&local_8b0);
      local_940._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_8c8);
      cfd::core::TapBranch::~TapBranch(&local_940);
      if (local_958 != (pointer)0x0) {
        operator_delete(local_958);
      }
      if (local_970 != (_func_int **)0x0) {
        operator_delete(local_970);
      }
      if (local_988 != (pointer)0x0) {
        operator_delete(local_988);
      }
      if ((undefined1 *)local_9b8._16_8_ != local_998) {
LAB_00417833:
        operator_delete((void *)local_9b8._16_8_);
      }
    }
    else {
      bVar3 = cfd::core::Script::Equals(&local_a20,&local_a90);
      if (!bVar3) {
        local_9b8._0_8_ = local_9b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_9b8,"locking_script is not match redeem_script.","");
        local_ad8._0_8_ = "cfdcapi_psbt.cpp";
        local_ad8._8_4_ = 0x582;
        local_ac8._M_allocated_capacity = 0x5e3cf4;
        cfd::core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_ad8,kCfdLogLevelWarning,"{}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8);
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_ad8,"Failed to parameter. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9b8);
        cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_ad8);
        __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      type = *(NetType_conflict *)((long)psbt_handle + 0x10);
      cfd::core::HashUtil::Hash160((ByteData160 *)local_ad8,(Script *)local_198);
      cfd::core::Address::Address
                ((Address *)local_9b8,type,kP2shP2wshAddress,(ByteData160 *)local_ad8);
      cfd::core::Address::operator=((Address *)local_4e8,(Address *)local_9b8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_870);
      cfd::core::Script::~Script(&local_8b0);
      local_940._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_8c8);
      cfd::core::TapBranch::~TapBranch(&local_940);
      if (local_958 != (pointer)0x0) {
        operator_delete(local_958);
      }
      if (local_970 != (_func_int **)0x0) {
        operator_delete(local_970);
      }
      if (local_988 != (pointer)0x0) {
        operator_delete(local_988);
      }
      if ((undefined1 *)local_9b8._16_8_ != local_998) {
        operator_delete((void *)local_9b8._16_8_);
      }
      local_9b8._16_8_ = local_ad8._0_8_;
      if ((pointer)local_ad8._0_8_ != (pointer)0x0) goto LAB_00417833;
    }
    cfd::core::Script::~Script(&local_a20);
    cfd::core::Script::~Script((Script *)local_198);
  }
  cfd::core::Script::~Script((Script *)local_660);
  local_9b8._0_8_ = (pointer)0x0;
  local_9b8._8_8_ = (pointer)0x0;
  local_9b8._16_8_ = (undefined1 *)0x0;
  pPVar2 = *(Psbt **)((long)psbt_handle + 0x18);
  cfd::core::Amount::Amount((Amount *)local_660,amount);
  uVar4 = cfd::Psbt::AddTxOutData
                    (pPVar2,(Amount *)local_660,(Address *)local_4e8,&local_a58,
                     (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_9b8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_9b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_3a0);
  cfd::core::Script::~Script(&local_3e0);
  local_470._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_3f8);
  cfd::core::TapBranch::~TapBranch(&local_470);
  if (local_488 != (pointer)0x0) {
    operator_delete(local_488);
  }
  if (local_4a0 != (_func_int **)0x0) {
    operator_delete(local_4a0);
  }
  if (local_4b8 != (pointer)0x0) {
    operator_delete(local_4b8);
  }
  if ((undefined1 *)local_4e8._16_8_ != local_4c8) {
    operator_delete((void *)local_4e8._16_8_);
  }
  local_ab8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_ab8.prefix_list_);
LAB_00417963:
  if (index != (uint32_t *)0x0) {
    *index = uVar4;
  }
  cfd::core::Script::~Script(&local_a58);
  cfd::core::Script::~Script(&local_a90);
  return 0;
}

Assistant:

int CfdAddPsbtTxOutWithScript(
    void* handle, void* psbt_handle, int64_t amount,
    const char* locking_script, const char* redeem_script,
    const char* descriptor, uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script;
    Script redeem_script_obj;
    uint32_t txout_index = 0;
    if (!IsEmptyString(locking_script)) script = Script(locking_script);
    if (!IsEmptyString(redeem_script)) {
      redeem_script_obj = Script(redeem_script);
    }

    if (!IsEmptyString(descriptor)) {
      Descriptor desc = Descriptor::Parse(descriptor);
      std::vector<std::string> path_args;
      auto key_list = desc.GetKeyDataAll();
      auto ref_list = desc.GetReferenceAll();
      Script temp_redeem_script;
      Address addr;
      auto ref = ref_list.front();
      addr = ref.GenerateAddress(psbt_obj->net_type);
      while (ref.HasChild()) {
        if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();
        ref = ref.GetChild();
      }
      if (ref.HasRedeemScript()) temp_redeem_script = ref.GetRedeemScript();

      if ((!script.IsEmpty()) && (!script.Equals(ref.GetLockingScript()))) {
        std::string err_msg = "locking_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      if ((!redeem_script_obj.IsEmpty()) &&
          (!redeem_script_obj.Equals(temp_redeem_script))) {
        std::string err_msg = "redeem_script doesn't match the descriptor.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }

      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, temp_redeem_script, key_list);
    } else if ((!redeem_script_obj.IsEmpty()) && (!script.IsEmpty())) {
      AddressFactory factory(psbt_obj->net_type);
      Address addr;
      if (script.IsP2wshScript()) {
        auto temp_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        if (!temp_script.Equals(script)) {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
        addr = factory.CreateP2wshAddress(redeem_script_obj);
      } else if (script.IsP2shScript()) {
        auto temp_sh_script =
            ScriptUtil::CreateP2shLockingScript(redeem_script_obj);
        auto temp_wsh_script =
            ScriptUtil::CreateP2wshLockingScript(redeem_script_obj);
        auto temp_script =
            ScriptUtil::CreateP2shLockingScript(temp_wsh_script);
        if (temp_sh_script.Equals(script)) {
          addr = factory.CreateP2shAddress(redeem_script_obj);
        } else if (temp_script.Equals(script)) {
          addr = Address(
              psbt_obj->net_type, AddressType::kP2shP2wshAddress,
              HashUtil::Hash160(temp_wsh_script));
        } else {
          std::string err_msg = "locking_script is not match redeem_script.";
          warn(CFD_LOG_SOURCE, "{}", err_msg);
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to parameter. " + err_msg);
        }
      } else {
        std::string err_msg = "locking_script is not support format.";
        warn(CFD_LOG_SOURCE, "{}", err_msg);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. " + err_msg);
      }
      std::vector<KeyData> key_list;
      txout_index = psbt_obj->psbt->AddTxOutData(
          Amount(amount), addr, redeem_script_obj, key_list);
    } else if (!script.IsEmpty()) {
      txout_index = psbt_obj->psbt->AddTxOut(script, Amount(amount));
    } else {
      warn(CFD_LOG_SOURCE, "locking_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking_script is null or empty.");
    }

    if (index != nullptr) *index = txout_index;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}